

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerHLSL::to_func_call_arg_abi_cxx11_
          (string *__return_storage_ptr__,CompilerHLSL *this,Parameter *arg,uint32_t id)

{
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  SPIRType *local_38;
  SPIRType *type;
  undefined1 local_25;
  uint32_t local_24;
  Parameter *pPStack_20;
  uint32_t id_local;
  Parameter *arg_local;
  CompilerHLSL *this_local;
  string *arg_str;
  
  local_25 = 0;
  local_24 = id;
  pPStack_20 = arg;
  arg_local = (Parameter *)this;
  this_local = (CompilerHLSL *)__return_storage_ptr__;
  CompilerGLSL::to_func_call_arg_abi_cxx11_(__return_storage_ptr__,&this->super_CompilerGLSL,arg,id)
  ;
  if (((0x1e < (this->hlsl_options).shader_model) &&
      (local_38 = Compiler::expression_type((Compiler *)this,local_24),
      local_38->basetype == SampledImage)) && ((local_38->image).dim != Buffer)) {
    to_sampler_expression_abi_cxx11_(&local_88,this,local_24);
    ::std::operator+(&local_68,", ",&local_88);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_68);
    ::std::__cxx11::string::~string((string *)&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerHLSL::to_func_call_arg(const SPIRFunction::Parameter &arg, uint32_t id)
{
	string arg_str = CompilerGLSL::to_func_call_arg(arg, id);

	if (hlsl_options.shader_model <= 30)
		return arg_str;

	// Manufacture automatic sampler arg if the arg is a SampledImage texture and we're in modern HLSL.
	auto &type = expression_type(id);

	// We don't have to consider combined image samplers here via OpSampledImage because
	// those variables cannot be passed as arguments to functions.
	// Only global SampledImage variables may be used as arguments.
	if (type.basetype == SPIRType::SampledImage && type.image.dim != DimBuffer)
		arg_str += ", " + to_sampler_expression(id);

	return arg_str;
}